

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int sasl_outcome_get_additional_data
              (SASL_OUTCOME_HANDLE sasl_outcome,amqp_binary *additional_data_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (sasl_outcome == (SASL_OUTCOME_HANDLE)0x0) {
    iVar3 = 0x2e3e;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(sasl_outcome->composite_value,&local_1c);
    iVar3 = 0x2e46;
    if ((iVar1 == 0) && (iVar3 = 0x2e4c, 1 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(sasl_outcome->composite_value,1);
      iVar3 = 0x2e54;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_binary(value,additional_data_value);
        iVar3 = 0x2e5b;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int sasl_outcome_get_additional_data(SASL_OUTCOME_HANDLE sasl_outcome, amqp_binary* additional_data_value)
{
    int result;

    if (sasl_outcome == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        if (amqpvalue_get_composite_item_count(sasl_outcome_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_outcome_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_binary(item_value, additional_data_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}